

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

void AsyncReadApt(positionTy ctr,double radius)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  char sErr [100];
  ifstream fIn;
  boundingBoxTy box;
  ifstream fScenery;
  string *in_stack_fffffffffffffa78;
  string *__buf;
  undefined4 uVar9;
  string local_570;
  ulong local_550;
  ThreadSettings local_548;
  string local_538 [3];
  string local_4d0;
  uint auStack_4b0 [122];
  boundingBoxTy local_2c8;
  long local_238 [4];
  int aiStack_218 [122];
  
  ThreadSettings::ThreadSettings(&local_548,"LT_ReadApt",0x1fbf,"C");
  boundingBoxTy::boundingBoxTy(&local_2c8,&ctr,radius,NAN);
  PurgeApt(&local_2c8);
  local_538[0]._M_dataplus._M_p = (pointer)&local_538[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_538,"Custom Scenery/scenery_packs.ini","");
  LTCalcFullPath(&local_4d0,local_538);
  std::ifstream::ifstream(local_238,(string *)&local_4d0,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538[0]._M_dataplus._M_p != &local_538[0].field_2) {
    operator_delete(local_538[0]._M_dataplus._M_p,local_538[0].field_2._M_allocated_capacity + 1);
  }
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffa78 >> 0x20);
  uVar6 = 0;
  local_550 = 0;
  if (bStopThread == false) {
    local_550 = 0;
    uVar6 = 0;
    do {
      uVar9 = (undefined4)((ulong)in_stack_fffffffffffffa78 >> 0x20);
      if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) break;
      cVar1 = std::__basic_file<char>::is_open();
      uVar9 = (undefined4)((ulong)in_stack_fffffffffffffa78 >> 0x20);
      if (cVar1 == '\0') break;
      local_570._M_string_length = 0;
      local_570.field_2._M_local_buf[0] = '\0';
      local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
      safeGetline((istream *)local_238,&local_570);
      if (0xd < local_570._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_4d0,(ulong)&local_570);
        iVar2 = std::__cxx11::string::compare((char *)&local_4d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if (iVar2 == 0) {
          std::__cxx11::string::erase((ulong)&local_570,0);
          uVar3 = std::__cxx11::string::compare((char *)&local_570);
          if ((int)uVar3 == 0) {
            local_550 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
          }
          else {
            LTCalcFullPath(&local_4d0,&local_570);
            std::__cxx11::string::operator=((string *)&local_570,(string *)&local_4d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_570);
            std::ifstream::ifstream(&local_4d0,(string *)&local_570,_S_in);
            uVar8 = *(uint *)((long)auStack_4b0 + *(long *)(local_4d0._M_dataplus._M_p + -0x18));
            if (uVar8 == 0) {
              cVar1 = std::__basic_file<char>::is_open();
              if (cVar1 != '\0') {
                if ((int)dataRefs.iLogLevel < 1) {
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                         ,0x989,"AsyncReadApt",logDEBUG,"Reading apt.dat from %s",
                         local_570._M_dataplus._M_p);
                }
                ReadOneAptFile((ifstream *)&local_4d0,&local_2c8);
                uVar6 = uVar6 + 1;
                uVar8 = *(uint *)((long)auStack_4b0 + *(long *)(local_4d0._M_dataplus._M_p + -0x18))
                ;
                goto LAB_00159b07;
              }
            }
            else {
LAB_00159b07:
              if ((uVar8 & 5) != 0) {
                piVar4 = __errno_location();
                if (((char)((uVar8 & 2) >> 1) == '\0' && *piVar4 != 2) &&
                   (strerror_r(*piVar4,(char *)local_538,100), (int)dataRefs.iLogLevel < 4)) {
                  in_stack_fffffffffffffa78 = local_538;
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                         ,0x993,"AsyncReadApt",logERR,"Could not read from \'%s\': %s",
                         local_570._M_dataplus._M_p,in_stack_fffffffffffffa78);
                }
              }
            }
            std::ifstream::close();
            std::ifstream::~ifstream(&local_4d0);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p,
                        CONCAT71(local_570.field_2._M_allocated_capacity._1_7_,
                                 local_570.field_2._M_local_buf[0]) + 1);
      }
      uVar9 = (undefined4)((ulong)in_stack_fffffffffffffa78 >> 0x20);
    } while (bStopThread == false);
  }
  if (bStopThread != false) goto LAB_00159d84;
  pcVar7 = "Resources/default scenery/default apt dat/Earth nav data/apt.dat";
  if ((local_550 & 1) != 0) {
    pcVar7 = "Global Scenery/Global Airports/Earth nav data/apt.dat";
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  pcVar5 = pcVar7 + 0x40;
  if ((local_550 & 1) != 0) {
    pcVar5 = pcVar7 + 0x35;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,pcVar7,pcVar5);
  LTCalcFullPath(&local_570,&local_4d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::ifstream(&local_4d0,(string *)&local_570,_S_in);
  uVar8 = *(uint *)((long)auStack_4b0 + *(long *)(local_4d0._M_dataplus._M_p + -0x18));
  if (uVar8 == 0) {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      if ((int)dataRefs.iLogLevel < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
               ,0x9a0,"AsyncReadApt",logDEBUG,"Reading global apt.dat from %s",
               local_570._M_dataplus._M_p);
      }
      ReadOneAptFile((ifstream *)&local_4d0,&local_2c8);
      uVar6 = uVar6 + 1;
      uVar8 = *(uint *)((long)auStack_4b0 + *(long *)(local_4d0._M_dataplus._M_p + -0x18));
      goto LAB_00159ce9;
    }
  }
  else {
LAB_00159ce9:
    if ((char)((uVar8 & 2) >> 1) == '\0' && (uVar8 & 5) != 0) {
      piVar4 = __errno_location();
      __buf = local_538;
      strerror_r(*piVar4,(char *)__buf,100);
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
               ,0x9aa,"AsyncReadApt",logERR,"Could not read from \'%s\': %s",
               local_570._M_dataplus._M_p,__buf);
        uVar9 = (undefined4)((ulong)__buf >> 0x20);
      }
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_4d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,
                    CONCAT71(local_570.field_2._M_allocated_capacity._1_7_,
                             local_570.field_2._M_local_buf[0]) + 1);
  }
LAB_00159d84:
  if (uVar6 == 0) {
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
             ,0x9b2,"AsyncReadApt",logWARN,
             "Could not open ANY apt.dat file. No runway/taxiway info available to guide ground traffic."
            );
    }
    CreateMsgWindow(8.0,logWARN,
                    "Could not open ANY apt.dat file. No runway/taxiway info available to guide ground traffic."
                   );
  }
  else if ((int)dataRefs.iLogLevel < 2) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp",
           0x9b7,"AsyncReadApt",logINFO,"Done reading from %d apt.dat files, have now %d airports",
           (ulong)uVar6,
           CONCAT44(uVar9,(undefined4)
                          gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count));
  }
  std::ifstream::~ifstream(local_238);
  ThreadSettings::~ThreadSettings(&local_548);
  return;
}

Assistant:

void AsyncReadApt (positionTy ctr, double radius)
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_ReadApt", LC_ALL_MASK);

    static size_t lenSceneryLnBegin = strlen(APTDAT_SCENERY_LN_BEGIN);
    
    // To avoid costly distance calculations we define a bounding box
    // just by calculating lat/lon values north/east/south/west of given pos
    // and include all airports with coordinates falling into it
    const boundingBoxTy box (ctr, radius);
    
    // --- Cleanup first: Remove too far away airports ---
    PurgeApt(box);
    
    // --- Add new airports ---
    // Count the number of files we have accessed
    int cntFiles = 0;
    bool bLooksLikeXP12 = false;            // XP12 Alpha introduced the *GLOBAL AIRPORTS* entry

    // Try opening scenery_packs.ini
    std::ifstream fScenery (LTCalcFullPath(APTDAT_SCENERY_PACKS));
    while (!bStopThread && fScenery.good() && fScenery.is_open())
    {
        // read a line from scenery_packs.ini
        std::string lnScenery;
        safeGetline(fScenery, lnScenery);
        
        // we only process lines starting with "SCENERY_PACK ",
        // ie. we skip any header info and also lines with SCENERY_PACK_DISABLED
        if (lnScenery.length() <= lenSceneryLnBegin ||
            lnScenery.substr(0,lenSceneryLnBegin) != APTDAT_SCENERY_LN_BEGIN)
            continue;

        // Remove the SCENERY_PACK part
        lnScenery.erase(0, lenSceneryLnBegin);

        // Starting with XP12 Alpha there's a special entry we can't read right here but need to take care of later
        if (lnScenery == APTDAT_SCENERY_GLOBAL_APTS) {
            bLooksLikeXP12 = true;
            continue;
        }

        // the remainder is a path into X-Plane's main folder
        lnScenery = LTCalcFullPath(lnScenery);      // make it a full path
        lnScenery += APTDAT_SCENERY_ADD_LOC;        // add the location to the actual `apt.dat` file
        
        // open that apt.dat
        std::ifstream fIn (lnScenery);
        if (fIn.good() && fIn.is_open()) {
            LOG_MSG(logDEBUG, "Reading apt.dat from %s", lnScenery.c_str());
            ReadOneAptFile(fIn, box);
            cntFiles++;
        }
        
        // problem was not just "not found" (which we ignore for scenery packs) or eof?
        if (!fIn && errno != ENOENT && !fIn.eof()) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_CFG_FILE_READ,
                    lnScenery.c_str(), sErr);
        }
        
        fIn.close();

    } // processing scenery_packs.ini
    
    // Last but not least we also process the global generic apt.dat file
    if (!bStopThread)
    {
        const std::string sFileName = LTCalcFullPath(bLooksLikeXP12 ? APTDAT_GLOBAL_AIRPORTS APTDAT_SCENERY_ADD_LOC : APTDAT_RESOURCES_DEFAULT APTDAT_SCENERY_ADD_LOC);
        std::ifstream fIn (sFileName);
        if (fIn.good() && fIn.is_open()) {
            LOG_MSG(logDEBUG, "Reading global apt.dat from %s", sFileName.c_str());
            ReadOneAptFile(fIn, box);
            cntFiles++;
        }

        // problem was not just eof?
        if (!fIn && !fIn.eof()) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_CFG_FILE_READ,
                    sFileName.c_str(), sErr);
        }
        
        fIn.close();
    }
    
    // Not successful in opening ANY apt.dat file?
    if (!cntFiles) {
        SHOW_MSG(logWARN, WARN_APTDAT_FAILED);
        return;
    }
    
    LOG_MSG(logINFO, "Done reading from %d apt.dat files, have now %d airports",
            cntFiles, (int)gmapApt.size());
}